

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void ssh2_bpp_queue_disconnect(BinaryPacketProtocol *bpp,char *msg,int category)

{
  BinarySink *bs;
  PktOut *pPVar1;
  
  pPVar1 = (*bpp->vt->new_pktout)(1);
  bs = pPVar1->binarysink_;
  BinarySink_put_uint32(bs,(long)category);
  BinarySink_put_stringz(bs,msg);
  BinarySink_put_stringz(bs,"en");
  pq_base_push(&(bpp->out_pq).pqb,&pPVar1->qnode);
  return;
}

Assistant:

void ssh2_bpp_queue_disconnect(BinaryPacketProtocol *bpp,
                               const char *msg, int category)
{
    PktOut *pkt = ssh_bpp_new_pktout(bpp, SSH2_MSG_DISCONNECT);
    put_uint32(pkt, category);
    put_stringz(pkt, msg);
    put_stringz(pkt, "en");            /* language tag */
    pq_push(&bpp->out_pq, pkt);
}